

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O2

void reader_deinit(FileReader reader)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  
  if (reader == (FileReader)0x0) {
    _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl","reader_deinit",0x15f);
    if ((DAT_001102fb & 0x10) != 0) {
      abort();
    }
  }
  reader_stop(reader);
  if (*reader != (FILE *)0x0) {
    fclose(*reader);
    *(undefined8 *)reader = 0;
  }
  uVar2 = 0;
  do {
    if (*(uint *)((long)reader + 0x68) <= uVar2) {
      if (*(long *)((long)reader + 0x50) != 0) {
        mpp_buffer_group_put();
        *(undefined8 *)((long)reader + 0x50) = 0;
      }
      if (*(long *)((long)reader + 0x70) != 0) {
        mpp_osal_free("reader_deinit");
      }
      *(undefined8 *)((long)reader + 0x70) = 0;
      mpp_osal_free("reader_deinit",reader);
      return;
    }
    lVar3 = *(long *)(*(long *)((long)reader + 0x70) + uVar2 * 8);
    if (lVar3 != 0) {
      if (*(long *)(lVar3 + 8) == 0) {
LAB_0010671d:
        mpp_osal_free("reader_deinit",lVar3);
        lVar1 = *(long *)((long)reader + 0x70);
      }
      else {
        mpp_buffer_put_with_caller(*(long *)(lVar3 + 8),"reader_deinit");
        *(undefined8 *)(lVar3 + 8) = 0;
        lVar1 = *(long *)((long)reader + 0x70);
        lVar3 = *(long *)(lVar1 + uVar2 * 8);
        if (lVar3 != 0) goto LAB_0010671d;
      }
      *(undefined8 *)(lVar1 + uVar2 * 8) = 0;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void reader_deinit(FileReader reader)
{
    FileReaderImpl *impl = (FileReaderImpl*)(reader);
    RK_U32 i;

    mpp_assert(impl);
    reader_stop(impl);

    if (impl->fp_input) {
        fclose(impl->fp_input);
        impl->fp_input = NULL;
    }

    for (i = 0; i < impl->slot_cnt; i++) {
        FileBufSlot *slot = impl->slots[i];
        if (!slot)
            continue;

        if (slot->buf) {
            mpp_buffer_put(slot->buf);
            slot->buf = NULL;
        }
        MPP_FREE(impl->slots[i]);
    }

    if (impl->group) {
        mpp_buffer_group_put(impl->group);
        impl->group = NULL;
    }

    MPP_FREE(impl->slots);
    MPP_FREE(impl);
}